

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_non_temporal_memcpy.cc
# Opt level: O0

crc32c_t __thiscall
absl::lts_20240722::crc_internal::CrcNonTemporalMemcpyEngine::Compute
          (CrcNonTemporalMemcpyEngine *this,void *dst,void *src,size_t length,crc32c_t initial_crc)

{
  string_view local_88;
  crc32c_t local_78;
  uint32_t local_74;
  size_type local_70;
  size_t final_copy_size;
  crc32c_t local_58;
  uint32_t local_54;
  ulong local_50;
  size_t offset;
  char *dst_bytes;
  char *src_bytes;
  size_t kBlockSize;
  size_t length_local;
  void *src_local;
  void *dst_local;
  CrcNonTemporalMemcpyEngine *this_local;
  crc32c_t initial_crc_local;
  crc32c_t crc;
  
  src_bytes = (char *)0x2000;
  offset = (size_t)dst;
  dst_bytes = (char *)src;
  kBlockSize = length;
  length_local = (size_t)src;
  src_local = dst;
  dst_local = this;
  this_local._0_4_ = initial_crc.crc_;
  this_local._4_4_ = initial_crc.crc_;
  for (local_50 = 0; local_50 + 0x2000 < kBlockSize; local_50 = local_50 + 0x2000) {
    local_58.crc_ = this_local._4_4_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&final_copy_size,
               dst_bytes + local_50,0x2000);
    local_54 = (uint32_t)ExtendCrc32c(local_58,_final_copy_size);
    this_local._4_4_ = (crc32c_t)local_54;
    non_temporal_store_memcpy((void *)(offset + local_50),dst_bytes + local_50,0x2000);
  }
  if (local_50 < kBlockSize) {
    local_70 = kBlockSize - local_50;
    local_78.crc_ = this_local._4_4_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_88,dst_bytes + local_50,local_70);
    local_74 = (uint32_t)ExtendCrc32c(local_78,local_88);
    this_local._4_4_ = (crc32c_t)local_74;
    non_temporal_store_memcpy((void *)(offset + local_50),dst_bytes + local_50,local_70);
  }
  return (crc32c_t)this_local._4_4_;
}

Assistant:

crc32c_t CrcNonTemporalMemcpyEngine::Compute(void* __restrict dst,
                                             const void* __restrict src,
                                             std::size_t length,
                                             crc32c_t initial_crc) const {
  constexpr size_t kBlockSize = 8192;
  crc32c_t crc = initial_crc;

  const char* src_bytes = reinterpret_cast<const char*>(src);
  char* dst_bytes = reinterpret_cast<char*>(dst);

  // Copy + CRC loop - run 8k chunks until we are out of full chunks.
  std::size_t offset = 0;
  for (; offset + kBlockSize < length; offset += kBlockSize) {
    crc = absl::ExtendCrc32c(crc,
                             absl::string_view(src_bytes + offset, kBlockSize));
    non_temporal_store_memcpy(dst_bytes + offset, src_bytes + offset,
                              kBlockSize);
  }

  // Save some work if length is 0.
  if (offset < length) {
    std::size_t final_copy_size = length - offset;
    crc = ExtendCrc32c(crc,
                       absl::string_view(src_bytes + offset, final_copy_size));

    non_temporal_store_memcpy(dst_bytes + offset, src_bytes + offset,
                              final_copy_size);
  }

  return crc;
}